

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::CleanupCommandsAndMacros(cmake *this)

{
  pointer pcVar1;
  cmStateSnapshot local_28;
  cmake *local_10;
  cmake *this_local;
  
  local_10 = this;
  pcVar1 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::Reset(&local_28,pcVar1);
  (this->CurrentSnapshot).State = local_28.State;
  (this->CurrentSnapshot).Position.Tree = local_28.Position.Tree;
  (this->CurrentSnapshot).Position.Position = local_28.Position.Position;
  pcVar1 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::RemoveUserDefinedCommands(pcVar1);
  cmStateSnapshot::SetDefaultDefinitions(&this->CurrentSnapshot);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::clear(&this->InstalledFiles);
  return;
}

Assistant:

void cmake::CleanupCommandsAndMacros()
{
  this->CurrentSnapshot = this->State->Reset();
  this->State->RemoveUserDefinedCommands();
  this->CurrentSnapshot.SetDefaultDefinitions();
  // FIXME: InstalledFiles probably belongs in the global generator.
  this->InstalledFiles.clear();
}